

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O0

void previewImageExamples(void)

{
  ostream *poVar1;
  Array2D<Imf_3_2::Rgba> *this;
  Array2D<Imf_3_2::Rgba> *unaff_retaddr;
  Array2D<Imf_3_2::Rgba> p;
  int h;
  int w;
  int in_stack_00000080;
  int in_stack_00000084;
  Array2D<Imf_3_2::Rgba> *in_stack_00000088;
  char *in_stack_00000090;
  int in_stack_000000b8;
  int in_stack_000000bc;
  char *in_stack_000000c0;
  long in_stack_fffffffffffffff0;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nfiles with preview images\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"drawing image then writing file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D(unaff_retaddr,0x32000000258,in_stack_fffffffffffffff0);
  drawImage1((Array2D<Imf_3_2::Rgba> *)p._sizeY,p._sizeX._4_4_,(int)p._sizeX);
  writeRgbaWithPreview1(in_stack_00000090,in_stack_00000088,in_stack_00000084,in_stack_00000080);
  this = (Array2D<Imf_3_2::Rgba> *)
         std::operator<<((ostream *)&std::cout,"drawing image while writing file");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  writeRgbaWithPreview2(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(this);
  return;
}

Assistant:

void
previewImageExamples ()
{
    cout << "\nfiles with preview images\n" << endl;

    cout << "drawing image then writing file" << endl;

    int w = 800;
    int h = 600;

    Array2D<Rgba> p (h, w);
    drawImage1 (p, w, h);
    writeRgbaWithPreview1 ("rgbaWithPreview1.exr", p, w, h);

    cout << "drawing image while writing file" << endl;

    writeRgbaWithPreview2 ("rgbaWithPreview2.exr", w, h);

    cout << endl;
}